

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O0

uint16_t dns_get_edns_udp_payload_size(char *rsp,size_t len)

{
  char *pcVar1;
  char *opt;
  size_t len_local;
  char *rsp_local;
  
  pcVar1 = dns_get_edns_opt(rsp,len);
  if (pcVar1 == (char *)0x0) {
    rsp_local._6_2_ = 0;
  }
  else {
    rsp_local._6_2_ = ntohs(*(uint16_t *)(pcVar1 + 3));
  }
  return rsp_local._6_2_;
}

Assistant:

uint16_t dns_get_edns_udp_payload_size(const char * rsp, size_t len)
{
    const char * opt = dns_get_edns_opt(rsp, len);

    if (opt)
        return ntohs(*(uint16_t *)(opt 
                                   + 1                // NAME
                                   + sizeof(uint16_t) // OPT
                                  ));
    return 0;
}